

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compat.hpp
# Opt level: O3

string * __thiscall
toml::cxx::to_string_abi_cxx11_(string *__return_storage_ptr__,cxx *this,source_location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pcVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  uint uVar12;
  uint uVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(long **)this == (long *)0x0) {
    __s = "";
  }
  else {
    __s = (char *)**(long **)this;
    if (__s == (char *)0x0) {
      paVar3 = &local_d0.field_2;
      local_d0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," at line ","");
      uVar9 = 1;
      if (*(long *)this == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = *(uint *)(*(long *)this + 0x10);
        if (9 < uVar13) {
          uVar8 = 4;
          uVar12 = uVar13;
          do {
            uVar9 = uVar8;
            if (uVar12 < 100) {
              uVar9 = uVar9 - 2;
              goto LAB_003adcbb;
            }
            if (uVar12 < 1000) {
              uVar9 = uVar9 - 1;
              goto LAB_003adcbb;
            }
            if (uVar12 < 10000) goto LAB_003adcbb;
            bVar7 = 99999 < uVar12;
            uVar8 = uVar9 + 4;
            uVar12 = uVar12 / 10000;
          } while (bVar7);
          uVar9 = uVar9 + 1;
        }
      }
LAB_003adcbb:
      paVar1 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_90,(ulong)uVar9,'\0');
      CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar13);
      uVar2 = CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length) +
              local_d0._M_string_length;
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar3) {
        uVar14 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < uVar2) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          uVar14 = local_90.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < uVar2) goto LAB_003add22;
        pbVar11 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                            (&local_90,0,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      }
      else {
LAB_003add22:
        pbVar11 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            (&local_d0,local_90._M_dataplus._M_p,
                             CONCAT44(local_90._M_string_length._4_4_,
                                      (uint)local_90._M_string_length));
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar11->_M_dataplus)._M_p;
      paVar4 = &pbVar11->field_2;
      if (paVar5 == paVar4) {
        local_f0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
      }
      else {
        local_f0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_f0._M_dataplus._M_p = (pointer)paVar5;
      }
      local_f0._M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar11->_M_string_length = 0;
      paVar4->_M_local_buf[0] = '\0';
      paVar4 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," in unknown file","");
      uVar2 = CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length) +
              local_f0._M_string_length;
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar14 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < uVar2) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar4) {
          uVar14 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < uVar2) goto LAB_003addf7;
        pbVar11 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                            (&local_b0,0,0,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      }
      else {
LAB_003addf7:
        pbVar11 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            (&local_f0,local_b0._M_dataplus._M_p,
                             CONCAT44(local_b0._M_string_length._4_4_,
                                      (uint)local_b0._M_string_length));
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = (pbVar11->_M_dataplus)._M_p;
      paVar5 = &pbVar11->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar6 == paVar5) {
        uVar14 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar14;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar11->_M_string_length;
      (pbVar11->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar11->_M_string_length = 0;
      paVar5->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar4) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_90.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
      _Var15._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar3) {
        return __return_storage_ptr__;
      }
      goto LAB_003adea6;
    }
  }
  paVar3 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," at line ","");
  uVar9 = 1;
  if (*(long *)this == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = *(uint *)(*(long *)this + 0x10);
    if (9 < uVar13) {
      uVar8 = 4;
      uVar12 = uVar13;
      do {
        uVar9 = uVar8;
        if (uVar12 < 100) {
          uVar9 = uVar9 - 2;
          goto LAB_003ad9a8;
        }
        if (uVar12 < 1000) {
          uVar9 = uVar9 - 1;
          goto LAB_003ad9a8;
        }
        if (uVar12 < 10000) goto LAB_003ad9a8;
        bVar7 = 99999 < uVar12;
        uVar8 = uVar9 + 4;
        uVar12 = uVar12 / 10000;
      } while (bVar7);
      uVar9 = uVar9 + 1;
    }
  }
LAB_003ad9a8:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_b0,(ulong)uVar9,'\0');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_b0._M_dataplus._M_p,(uint)local_b0._M_string_length,uVar13);
  uVar2 = CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length) +
          CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar3) {
    uVar14 = local_90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < uVar2) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar14 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < uVar2) goto LAB_003ada0f;
    pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_b0,0,0,local_90._M_dataplus._M_p,
                      CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length));
  }
  else {
LAB_003ada0f:
    pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_90,local_b0._M_dataplus._M_p,
                        CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length));
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar11->_M_dataplus)._M_p;
  paVar1 = &pbVar11->field_2;
  if (paVar4 == paVar1) {
    local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0.field_2._8_4_ = *(undefined4 *)((long)&pbVar11->field_2 + 8);
    local_d0.field_2._12_4_ = *(undefined4 *)((long)&pbVar11->field_2 + 0xc);
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0._M_dataplus._M_p = (pointer)paVar4;
  }
  local_d0._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar11->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," in file ","");
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar14 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_50._M_string_length + local_d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      uVar14 = local_50.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_50._M_string_length + local_d0._M_string_length) goto LAB_003adae3;
    pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_50,0,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  }
  else {
LAB_003adae3:
    pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_d0,local_50._M_dataplus._M_p,local_50._M_string_length);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar11->_M_dataplus)._M_p;
  paVar4 = &pbVar11->field_2;
  if (paVar5 == paVar4) {
    local_f0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)paVar5;
  }
  local_f0._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar11->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  paVar4 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar4;
  sVar10 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar10);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    uVar14 = local_f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_70._M_string_length + local_f0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar4) {
      uVar14 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_70._M_string_length + local_f0._M_string_length) goto LAB_003adbbf;
    pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_70,0,0,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  }
  else {
LAB_003adbbf:
    pbVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_f0,local_70._M_dataplus._M_p,local_70._M_string_length);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar6 = (pbVar11->_M_dataplus)._M_p;
  paVar5 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 == paVar5) {
    uVar14 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar14;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar11->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar4) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  _Var15._M_p = local_90._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar3) {
    return __return_storage_ptr__;
  }
LAB_003adea6:
  operator_delete(_Var15._M_p,local_90.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const source_location& loc)
{
    const char* fname = loc.file_name();
    if(fname)
    {
        return std::string(" at line ") + std::to_string(loc.line()) +
               std::string(" in file ") + std::string(fname);
    }
    else
    {
        return std::string(" at line ") + std::to_string(loc.line()) +
               std::string(" in unknown file");
    }
}